

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O0

UINT8 GYMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)

{
  UINT32 UVar1;
  int *piVar2;
  byte *pbVar3;
  DATA_LOADER *dataLoader_local;
  
  DataLoader_ReadUntil(dataLoader,4);
  UVar1 = DataLoader_GetSize(dataLoader);
  if (UVar1 < 4) {
    dataLoader_local._7_1_ = 0xf1;
  }
  else {
    piVar2 = (int *)DataLoader_GetData(dataLoader);
    if (*piVar2 == 0x584d5947) {
      dataLoader_local._7_1_ = '\0';
    }
    else {
      pbVar3 = DataLoader_GetData(dataLoader);
      if (*pbVar3 < 4) {
        dataLoader_local._7_1_ = '\0';
      }
      else {
        dataLoader_local._7_1_ = 0xf0;
      }
    }
  }
  return dataLoader_local._7_1_;
}

Assistant:

UINT8 GYMPlayer::PlayerCanLoadFile(DATA_LOADER *dataLoader)
{
	DataLoader_ReadUntil(dataLoader,0x04);
	if (DataLoader_GetSize(dataLoader) < 0x04)
		return 0xF1;	// file too small
	if (! memcmp(&DataLoader_GetData(dataLoader)[0x00], "GYMX", 4))
		return 0x00;	// valid GYMX header
	if (DataLoader_GetData(dataLoader)[0x00] <= 0x03)	// check for a valid command byte
		return 0x00;
	return 0xF0;	// invalid file
}